

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

string * __thiscall
pbrt::MLTIntegrator::ToString_abi_cxx11_(string *__return_storage_ptr__,MLTIntegrator *this)

{
  bool *in_stack_ffffffffffffffe0;
  
  StringPrintf<pbrt::CameraHandle_const&,int_const&,int_const&,int_const&,int_const&,float_const&,float_const&,pbrt::LightSamplerHandle_const&,bool_const&>
            (__return_storage_ptr__,
             (pbrt *)
             "[ MLTIntegrator camera: %s maxDepth: %d nBootstrap: %d nChains: %d mutationsPerPixel: %d sigma: %f largeStepProbability: %f lightSampler: %s regularize: %s ]"
             ,(char *)&this->camera,(CameraHandle *)&this->maxDepth,&this->nBootstrap,&this->nChains
             ,&this->mutationsPerPixel,(int *)&this->sigma,&this->largeStepProbability,
             (float *)&this->lightSampler,(LightSamplerHandle *)&this->regularize,
             in_stack_ffffffffffffffe0);
  return __return_storage_ptr__;
}

Assistant:

std::string MLTIntegrator::ToString() const {
    return StringPrintf("[ MLTIntegrator camera: %s maxDepth: %d nBootstrap: %d "
                        "nChains: %d mutationsPerPixel: %d sigma: %f "
                        "largeStepProbability: %f lightSampler: %s regularize: %s ]",
                        camera, maxDepth, nBootstrap, nChains, mutationsPerPixel, sigma,
                        largeStepProbability, lightSampler, regularize);
}